

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O1

AssertionResult * __thiscall
iutest::internal::
CmpHelperEQ<int,iutest::detail::peep::Peep<test::prod_test::ProdClass,test::prod_test::iu_peep_tag_m_y<test::prod_test::ProdClass>>::peep_static_impl<test::prod_test::ProdClass,int*,false>>
          (AssertionResult *__return_storage_ptr__,internal *this,char *expected_str,
          char *actual_str,int *expected,
          peep_static_impl<test::prod_test::ProdClass,_int_*,_false> *actual)

{
  int *piVar1;
  string local_68;
  string local_48;
  
  if (*detail::peep_tag<test::prod_test::iu_peep_tag_m_y<test::prod_test::ProdClass>>::value ==
      *(int *)actual_str) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  else {
    piVar1 = (int *)actual_str;
    FormatForComparisonFailureMessage<int,iutest::detail::peep::Peep<test::prod_test::ProdClass,test::prod_test::iu_peep_tag_m_y<test::prod_test::ProdClass>>::peep_static_impl<test::prod_test::ProdClass,int*,false>>
              (&local_48,(internal *)actual_str,expected,
               (peep_static_impl<test::prod_test::ProdClass,_int_*,_false> *)actual_str);
    FormatForComparisonFailureMessage<iutest::detail::peep::Peep<test::prod_test::ProdClass,test::prod_test::iu_peep_tag_m_y<test::prod_test::ProdClass>>::peep_static_impl<test::prod_test::ProdClass,int*,false>,int>
              (&local_68,(internal *)expected,
               (peep_static_impl<test::prod_test::ProdClass,_int_*,_false> *)actual_str,piVar1);
    EqFailure(__return_storage_ptr__,(char *)this,expected_str,&local_48,&local_68,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( iuOperatorEQ(actual, expected) )
    {
        return AssertionSuccess();
    }